

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  FILE *whereto;
  hsts *phVar1;
  CURLcode CVar2;
  int iVar3;
  CURLSTScode CVar4;
  Curl_llist_node *pCVar5;
  void *pvVar6;
  char *pcVar7;
  char *tempstore;
  FILE *out;
  char *local_b0;
  hsts *local_a8;
  curl_index i;
  tm local_90;
  curl_hstsentry e;
  
  tempstore = (char *)0x0;
  if (h == (hsts *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    if (file == (char *)0x0) {
      file = h->filename;
    }
    CVar2 = CURLE_OK;
    if (((file != (char *)0x0) && ((h->flags & 2) == 0)) && (*file != '\0')) {
      CVar2 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar2 == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        pCVar5 = Curl_llist_head(&h->list);
        pcVar7 = file;
        phVar1 = h;
        if (pCVar5 == (Curl_llist_node *)0x0) {
          CVar2 = CURLE_OK;
        }
        else {
          do {
            local_a8 = phVar1;
            local_b0 = pcVar7;
            pvVar6 = Curl_node_elem(pCVar5);
            pCVar5 = Curl_node_next(pCVar5);
            whereto = out;
            if (*(long *)((long)pvVar6 + 0x30) == 0x7fffffffffffffff) {
              pcVar7 = "";
              if (*(char *)((long)pvVar6 + 0x28) != '\0') {
                pcVar7 = ".";
              }
              curl_mfprintf(out,"%s%s \"%s\"\n",pcVar7,*(undefined8 *)((long)pvVar6 + 0x20),
                            "unlimited");
            }
            else {
              CVar2 = Curl_gmtime(*(long *)((long)pvVar6 + 0x30),&local_90);
              h = local_a8;
              file = local_b0;
              if (CVar2 != CURLE_OK) goto LAB_001313b9;
              pcVar7 = "";
              if (*(char *)((long)pvVar6 + 0x28) != '\0') {
                pcVar7 = ".";
              }
              curl_mfprintf(whereto,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar7,
                            *(undefined8 *)((long)pvVar6 + 0x20),(ulong)(local_90.tm_year + 0x76c),
                            (ulong)(local_90.tm_mon + 1),(ulong)(uint)local_90.tm_mday,
                            (ulong)(uint)local_90.tm_hour,(ulong)(uint)local_90.tm_min,
                            (ulong)(uint)local_90.tm_sec);
            }
            pcVar7 = local_b0;
            phVar1 = local_a8;
          } while (pCVar5 != (Curl_llist_node *)0x0);
          CVar2 = CURLE_OK;
          h = local_a8;
          file = local_b0;
        }
LAB_001313b9:
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar2 == CURLE_OK) {
          iVar3 = Curl_rename(tempstore,file);
          CVar2 = CURLE_WRITE_ERROR;
          if (iVar3 == 0) {
            CVar2 = CURLE_OK;
          }
        }
        if (tempstore != (char *)0x0 && CVar2 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
    if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
      i.total = Curl_llist_count(&h->list);
      i.index = 0;
      pCVar5 = Curl_llist_head(&h->list);
      if (pCVar5 != (Curl_llist_node *)0x0) {
        while( true ) {
          pvVar6 = Curl_node_elem(pCVar5);
          pCVar5 = Curl_node_next(pCVar5);
          e.name = *(char **)((long)pvVar6 + 0x20);
          e.namelen = strlen(e.name);
          e._16_1_ = *(undefined1 *)((long)pvVar6 + 0x28);
          if (*(long *)((long)pvVar6 + 0x30) == 0x7fffffffffffffff) {
            builtin_strncpy(e.expire,"unlimited",10);
          }
          else {
            CVar2 = Curl_gmtime(*(long *)((long)pvVar6 + 0x30),&local_90);
            if (CVar2 != CURLE_OK) {
              return CVar2;
            }
            curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",
                           (ulong)(local_90.tm_year + 0x76c),(ulong)(local_90.tm_mon + 1),
                           (ulong)(uint)local_90.tm_mday,(ulong)(uint)local_90.tm_hour,
                           (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
          }
          CVar4 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
          if (CVar4 == CURLSTS_FAIL) break;
          if (CVar4 != CURLSTS_OK) {
            return CURLE_OK;
          }
          i.index = i.index + 1;
          if (pCVar5 == (Curl_llist_node *)0x0) {
            return CURLE_OK;
          }
        }
        CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there is a write callback */
    struct curl_index i; /* count */
    i.total = Curl_llist_count(&h->list);
    i.index = 0;
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      bool stop;
      n = Curl_node_next(e);
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}